

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactor<double>::vSolveUpdateRight
          (CLUFactor<double> *this,double *vec,int *ridx,int n,double eps)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  double *pdVar10;
  int in_ECX;
  long in_RDX;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  long in_RDI;
  int m;
  int *lbeg;
  int *idx;
  int *lidx;
  int *lrow;
  double *val;
  double *lval;
  double y;
  double x;
  int end;
  int k;
  int j;
  int i;
  double in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  int *local_70;
  double *local_58;
  int local_30;
  int local_2c;
  int local_1c;
  
  lVar8 = CONCAT71(in_register_00000031,in_SIL);
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x25d2c3);
  lVar5 = *(long *)(in_RDI + 0x78);
  lVar6 = *(long *)(in_RDI + 0x98);
  lVar7 = *(long *)(in_RDI + 0x90);
  iVar2 = *(int *)(in_RDI + 0x88);
  local_1c = in_ECX;
  for (local_2c = *(int *)(in_RDI + 0x84); local_2c < iVar2; local_2c = local_2c + 1) {
    dVar1 = *(double *)(lVar8 + (long)*(int *)(lVar6 + (long)local_2c * 4) * 8);
    bVar9 = isNotZero<double,double>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (bVar9) {
      iVar3 = *(int *)(lVar7 + (long)local_2c * 4);
      local_70 = (int *)(lVar5 + (long)iVar3 * 4);
      local_58 = pdVar10 + iVar3;
      for (local_30 = *(int *)(lVar7 + (long)(local_2c + 1) * 4); iVar3 < local_30;
          local_30 = local_30 + -1) {
        iVar4 = *local_70;
        *(int *)(in_RDX + (long)local_1c * 4) = iVar4;
        in_stack_ffffffffffffff70 = *(double *)(lVar8 + (long)iVar4 * 8);
        local_1c = (uint)(in_stack_ffffffffffffff70 == 0.0) + local_1c;
        in_stack_ffffffffffffff70 = in_stack_ffffffffffffff70 - dVar1 * *local_58;
        if ((in_stack_ffffffffffffff70 == 0.0) && (!NAN(in_stack_ffffffffffffff70))) {
          in_stack_ffffffffffffff70 = 1e-100;
        }
        *(double *)(lVar8 + (long)iVar4 * 8) = in_stack_ffffffffffffff70;
        local_70 = local_70 + 1;
        local_58 = local_58 + 1;
      }
    }
  }
  return local_1c;
}

Assistant:

int CLUFactor<R>::vSolveUpdateRight(R* vec, int* ridx, int n, R eps)
{
   int i, j, k;
   int end;
   R x, y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);
      x = vec[lrow[i]];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = ridx[n] = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];
            n += (y == 0) ? 1 : 0;
            y = y - x * (*val++);
            vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
         }
      }
   }

   return n;
}